

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int hash_to_curve(secp256k1_ge *ge,uint8_t *pd,size_t len)

{
  int iVar1;
  long lVar2;
  uint8_t hash [32];
  secp256k1_fe x;
  secp256k1_sha256 local_e8;
  uchar local_78 [40];
  secp256k1_fe local_50;
  
  local_e8.s[0] = 0x6a09e667;
  local_e8.s[1] = 0xbb67ae85;
  local_e8.s[2] = 0x3c6ef372;
  local_e8.s[3] = 0xa54ff53a;
  local_e8.s[4] = 0x510e527f;
  local_e8.s[5] = 0x9b05688c;
  local_e8.s[6] = 0x1f83d9ab;
  local_e8.s[7] = 0x5be0cd19;
  local_e8.bytes = 0;
  secp256k1_sha256_write(&local_e8,pd,0x21);
  secp256k1_sha256_finalize(&local_e8,local_78);
  lVar2 = 0;
  do {
    iVar1 = secp256k1_fe_set_b32(&local_50,local_78);
    if (iVar1 != 0) {
      iVar1 = secp256k1_ge_set_xo_var(ge,&local_50,0);
      if (iVar1 != 0) {
        iVar1 = secp256k1_ge_is_valid_var(ge);
        if (iVar1 != 0) goto LAB_00115757;
      }
    }
    local_e8.s[0] = 0x6a09e667;
    local_e8.s[1] = 0xbb67ae85;
    local_e8.s[2] = 0x3c6ef372;
    local_e8.s[3] = 0xa54ff53a;
    local_e8.s[4] = 0x510e527f;
    local_e8.s[5] = 0x9b05688c;
    local_e8.s[6] = 0x1f83d9ab;
    local_e8.s[7] = 0x5be0cd19;
    local_e8.bytes = 0;
    secp256k1_sha256_write(&local_e8,local_78,0x20);
    secp256k1_sha256_finalize(&local_e8,local_78);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x80);
  lVar2 = 0x80;
LAB_00115757:
  return (int)(lVar2 == 0x80);
}

Assistant:

static int hash_to_curve(secp256k1_ge *ge, const uint8_t *pd, size_t len)
{
    secp256k1_fe x;
    uint8_t hash[32];
    size_t k, safety = 128;
    secp256k1_sha256 sha256_m;

    secp256k1_sha256_initialize(&sha256_m);
    secp256k1_sha256_write(&sha256_m, pd, len);
    secp256k1_sha256_finalize(&sha256_m, hash);

    for (k = 0; k < safety; ++k) {
        if (secp256k1_fe_set_b32(&x, hash)
            && secp256k1_ge_set_xo_var(ge, &x, 0)
            && secp256k1_ge_is_valid_var(ge)) { /* Is secp256k1_ge_is_valid_var necessary? */
            break;
        }

        secp256k1_sha256_initialize(&sha256_m);
        secp256k1_sha256_write(&sha256_m, hash, 32);
        secp256k1_sha256_finalize(&sha256_m, hash);
    }

    if (k == safety) {
        return 1; /* failed */
    }
    return 0;
}